

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool tinyusdz::anon_unknown_160::CompositeSublayersRec
               (AssetResolutionResolver *resolver,Layer *in_layer,
               vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *layer_names_stack,Layer *composited_layer,string *warn,string *err,
               SublayersCompositionOptions *options)

{
  key_type *__k;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer psVar1;
  pointer pcVar2;
  _Rep_type *p_Var3;
  undefined8 uVar4;
  bool bVar5;
  ulong uVar6;
  const_iterator cVar7;
  iterator iVar8;
  const_iterator cVar9;
  ostream *poVar10;
  string *err_00;
  long lVar11;
  _Hash_node_base *p_Var12;
  pointer args;
  undefined1 local_18a8 [40];
  string sublayer_asset_path;
  string layer_filepath;
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1810;
  string local_17f8;
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_17d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
  *local_17d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_17c8;
  pointer local_17c0;
  ostringstream ss_e_2;
  size_type local_17b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17a8;
  _Alloc_hider local_1798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1788;
  _Alloc_hider local_1778;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1768;
  _Alloc_hider local_1758;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1748;
  _Alloc_hider local_1738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1728;
  _Alloc_hider local_1718;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1708 [12];
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1640;
  Layer sublayer;
  
  uVar6 = ((long)(layer_names_stack->
                 super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(layer_names_stack->
                 super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if (uVar6 < options->max_depth || uVar6 - options->max_depth == 0) {
    sublayer._name.field_2._8_8_ = &sublayer._name._M_string_length;
    sublayer._name._M_dataplus._M_p = (pointer)0x0;
    sublayer._name._M_string_length = 0;
    sublayer._name.field_2._M_allocated_capacity = 0;
    sublayer._prim_specs._M_h._M_bucket_count = 0;
    err_00 = warn;
    sublayer._prim_specs._M_h._M_buckets = (__buckets_ptr)sublayer._name.field_2._8_8_;
    ::std::
    vector<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::allocator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
    ::
    emplace_back<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((vector<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::allocator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
                *)layer_names_stack,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sublayer);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sublayer,(_Link_type)sublayer._name.field_2._M_allocated_capacity);
    psVar1 = (layer_names_stack->
             super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    p_Var12 = (in_layer->_prim_specs)._M_h._M_before_begin._M_nxt;
    if (p_Var12 != (_Hash_node_base *)0x0) {
      do {
        __k = (key_type *)(p_Var12 + 1);
        cVar7 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(composited_layer->_prim_specs)._M_h,__k);
        if (cVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
            ._M_cur == (__node_type *)0x0) {
          Layer::add_primspec(composited_layer,__k,(PrimSpec *)(p_Var12 + 5));
        }
        else {
          iVar8 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(composited_layer->_prim_specs)._M_h,__k);
          if (iVar8.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
              ._M_cur == (__node_type *)0x0) {
            ::std::__throw_out_of_range("_Map_base::at");
          }
          bVar5 = CombinePrimSpecRec(0,(PrimSpec *)
                                       ((long)iVar8.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                                              ._M_cur + 0x28),(PrimSpec *)(p_Var12 + 5),err,err_00);
          if (!bVar5) {
            return false;
          }
        }
        p_Var12 = p_Var12->_M_nxt;
      } while (p_Var12 != (_Hash_node_base *)0x0);
    }
    args = (in_layer->_metas).subLayers.
           super__Vector_base<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>._M_impl.
           super__Vector_impl_data._M_start;
    local_17c0 = (in_layer->_metas).subLayers.
                 super__Vector_base<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>._M_impl
                 .super__Vector_impl_data._M_finish;
    if (args != local_17c0) {
      local_17c8 = &in_layer->_asset_search_paths;
      local_17d0 = &options->fileformats;
      local_18a8._32_8_ = err;
      local_17d8 = layer_names_stack;
      do {
        sublayer_asset_path._M_dataplus._M_p = (pointer)&sublayer_asset_path.field_2;
        pcVar2 = (args->assetPath).asset_path_._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&sublayer_asset_path,pcVar2,
                   pcVar2 + (args->assetPath).asset_path_._M_string_length);
        ::std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector(&local_1810,layer_names_stack);
        if (local_1810.
            super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_1810.
            super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar11 = 8;
          uVar6 = 0;
          do {
            p_Var3 = &(local_1810.
                       super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t;
            cVar9 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)local_1810.
                                     super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8),
                           &sublayer_asset_path);
            if ((_Base_ptr)(&(p_Var3->_M_impl).field_0x0 + lVar11) != cVar9._M_node) {
              ::std::
              vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::~vector(&local_1810);
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&sublayer);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sublayer,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&sublayer,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sublayer,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&sublayer,"CompositeSublayersRec",0x15);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sublayer,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<(&sublayer,0x1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              layer_filepath._M_dataplus._M_p = (pointer)&layer_filepath.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&layer_filepath,
                         "Circular referenceing detected for subLayer: {} in {}","");
              local_18a8._0_8_ = local_18a8 + 0x10;
              pcVar2 = (in_layer->_name)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_18a8,pcVar2,pcVar2 + (in_layer->_name)._M_string_length);
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        ((string *)&ss_e_2,(fmt *)&layer_filepath,&sublayer_asset_path,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_18a8,err_00);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&sublayer,_ss_e_2,local_17b0);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_ss_e_2 != &local_17a8) {
                operator_delete(_ss_e_2,local_17a8._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_18a8._0_8_ != local_18a8 + 0x10) {
                operator_delete((void *)local_18a8._0_8_,local_18a8._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)layer_filepath._M_dataplus._M_p != &layer_filepath.field_2) {
                operator_delete(layer_filepath._M_dataplus._M_p,
                                layer_filepath.field_2._M_allocated_capacity + 1);
              }
              uVar4 = local_18a8._32_8_;
              if ((string *)local_18a8._32_8_ != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)uVar4,(ulong)_ss_e_2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_ss_e_2 != &local_17a8) {
                  operator_delete(_ss_e_2,local_17a8._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sublayer);
              ::std::ios_base::~ios_base((ios_base *)&sublayer._metas.upAxis._metas.comment);
              goto LAB_001a913c;
            }
            uVar6 = uVar6 + 1;
            lVar11 = lVar11 + 0x30;
          } while (uVar6 < (ulong)(((long)local_1810.
                                          super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1810.
                                          super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                  -0x5555555555555555));
        }
        ::std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_1810);
        AssetResolutionResolver::resolve(&layer_filepath,resolver,&sublayer_asset_path);
        if (layer_filepath._M_string_length == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&sublayer);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sublayer,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&sublayer,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sublayer,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&sublayer,"CompositeSublayersRec",0x15);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sublayer,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<(&sublayer,0x1ef);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          local_18a8._0_8_ = local_18a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_18a8,"{} not found in path: {}","");
          AssetResolutionResolver::search_paths_str_abi_cxx11_(&local_17f8,resolver);
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)&ss_e_2,(fmt *)local_18a8,&sublayer_asset_path,&local_17f8,err_00);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&sublayer,_ss_e_2,local_17b0);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_ss_e_2 != &local_17a8) {
            operator_delete(_ss_e_2,local_17a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_17f8._M_dataplus._M_p != &local_17f8.field_2) {
            operator_delete(local_17f8._M_dataplus._M_p,local_17f8.field_2._M_allocated_capacity + 1
                           );
          }
          if ((undefined1 *)local_18a8._0_8_ != local_18a8 + 0x10) {
            operator_delete((void *)local_18a8._0_8_,local_18a8._16_8_ + 1);
          }
          uVar4 = local_18a8._32_8_;
          if ((string *)local_18a8._32_8_ != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)uVar4,(ulong)_ss_e_2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_ss_e_2 != &local_17a8) {
              operator_delete(_ss_e_2,local_17a8._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sublayer);
          ::std::ios_base::~ios_base((ios_base *)&sublayer._metas.upAxis._metas.comment);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)layer_filepath._M_dataplus._M_p != &layer_filepath.field_2) {
            operator_delete(layer_filepath._M_dataplus._M_p,
                            layer_filepath.field_2._M_allocated_capacity + 1);
          }
LAB_001a913c:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sublayer_asset_path._M_dataplus._M_p != &sublayer_asset_path.field_2) {
LAB_001a9146:
            operator_delete(sublayer_asset_path._M_dataplus._M_p,
                            sublayer_asset_path.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001a9153;
        }
        sublayer._name._M_dataplus._M_p = (pointer)&sublayer._name.field_2;
        sublayer._name._M_string_length = 0;
        sublayer._name.field_2._M_allocated_capacity =
             sublayer._name.field_2._M_allocated_capacity & 0xffffffffffffff00;
        sublayer._prim_specs._M_h._M_buckets = &sublayer._prim_specs._M_h._M_single_bucket;
        sublayer._prim_specs._M_h._M_bucket_count = 1;
        sublayer._prim_specs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        sublayer._prim_specs._M_h._M_element_count = 0;
        sublayer._prim_specs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        sublayer._prim_specs._M_h._M_rehash_policy._M_next_resize = 0;
        sublayer._prim_specs._M_h._M_single_bucket = (__node_base_ptr)0x0;
        LayerMetas::LayerMetas(&sublayer._metas);
        sublayer._primspec_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
        ;
        sublayer._primspec_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        sublayer._primspec_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &sublayer._primspec_path_cache._M_t._M_impl.super__Rb_tree_header._M_header;
        sublayer._primspec_path_cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        sublayer._dirty = true;
        sublayer._has_unresolved_references = true;
        sublayer._has_unresolved_payload = true;
        sublayer._has_unresolved_variant = true;
        sublayer._has_unresolved_inherits = true;
        sublayer._has_unresolved_specializes = true;
        sublayer._has_over_primspec = true;
        sublayer._has_class_primspec = true;
        sublayer._current_working_path._M_dataplus._M_p =
             (pointer)&sublayer._current_working_path.field_2;
        sublayer._current_working_path._M_string_length = 0;
        sublayer._current_working_path.field_2._M_local_buf[0] = '\0';
        sublayer._asset_search_paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        sublayer._asset_resolution_userdata = (void *)0x0;
        sublayer._asset_search_paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sublayer._asset_search_paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_18a8._0_8_ = local_18a8 + 0x10;
        pcVar2 = (in_layer->_current_working_path)._M_dataplus._M_p;
        sublayer._primspec_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             sublayer._primspec_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_18a8,pcVar2,
                   pcVar2 + (in_layer->_current_working_path)._M_string_length);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_17f8,local_17c8);
        Path::make_root_path();
        uVar4 = local_18a8._32_8_;
        bVar5 = LoadAsset((anon_unknown_160 *)resolver,(AssetResolutionResolver *)local_18a8,
                          &local_17f8,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_17d0,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                           *)(args->assetPath).asset_path_._M_dataplus._M_p,
                          (AssetPath *)(args->assetPath).asset_path_._M_string_length,
                          (Path *)&ss_e_2,&sublayer,(PrimSpec **)0x0,
                          options->error_when_no_prims_in_sublayer,
                          options->error_when_asset_not_found,
                          options->error_when_unsupported_fileformat,warn,
                          (string *)local_18a8._32_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1718._M_p != local_1708) {
          operator_delete(local_1718._M_p,local_1708[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1738._M_p != &local_1728) {
          operator_delete(local_1738._M_p,local_1728._M_allocated_capacity + 1);
        }
        layer_names_stack = local_17d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1758._M_p != &local_1748) {
          operator_delete(local_1758._M_p,local_1748._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1778._M_p != &local_1768) {
          operator_delete(local_1778._M_p,local_1768._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1798._M_p != &local_1788) {
          operator_delete(local_1798._M_p,local_1788._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss_e_2 != &local_17a8) {
          operator_delete(_ss_e_2,local_17a8._M_allocated_capacity + 1);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_17f8);
        if ((undefined1 *)local_18a8._0_8_ != local_18a8 + 0x10) {
          operator_delete((void *)local_18a8._0_8_,local_18a8._16_8_ + 1);
        }
        if (!bVar5) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_2);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_2,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_2,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_2,"CompositeSublayersRec",0x15);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_2,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_2,0x1fb);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          local_17f8._M_dataplus._M_p = (pointer)&local_17f8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_17f8,"Load asset in subLayer failed: `{}`","");
          fmt::format<tinyusdz::value::AssetPath>((string *)local_18a8,&local_17f8,&args->assetPath)
          ;
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&ss_e_2,(char *)local_18a8._0_8_,local_18a8._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((undefined1 *)local_18a8._0_8_ != local_18a8 + 0x10) {
            operator_delete((void *)local_18a8._0_8_,local_18a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_17f8._M_dataplus._M_p != &local_17f8.field_2) {
            operator_delete(local_17f8._M_dataplus._M_p,local_17f8.field_2._M_allocated_capacity + 1
                           );
          }
          uVar4 = local_18a8._32_8_;
          if ((string *)local_18a8._32_8_ != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)uVar4,local_18a8._0_8_);
            if ((undefined1 *)local_18a8._0_8_ != local_18a8 + 0x10) {
              operator_delete((void *)local_18a8._0_8_,local_18a8._16_8_ + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_2);
          ::std::ios_base::~ios_base((ios_base *)local_1748._M_local_buf);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&sublayer._asset_search_paths);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sublayer._current_working_path._M_dataplus._M_p !=
              &sublayer._current_working_path.field_2) {
            operator_delete(sublayer._current_working_path._M_dataplus._M_p,
                            CONCAT71(sublayer._current_working_path.field_2._M_allocated_capacity.
                                     _1_7_,sublayer._current_working_path.field_2._M_local_buf[0]) +
                            1);
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
          ::_M_erase(&sublayer._primspec_path_cache._M_t,
                     (_Link_type)
                     sublayer._primspec_path_cache._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent);
          LayerMetas::~LayerMetas(&sublayer._metas);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&sublayer._prim_specs._M_h);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sublayer._name._M_dataplus._M_p != &sublayer._name.field_2) {
            operator_delete(sublayer._name._M_dataplus._M_p,
                            sublayer._name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)layer_filepath._M_dataplus._M_p != &layer_filepath.field_2) {
            operator_delete(layer_filepath._M_dataplus._M_p,
                            layer_filepath.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sublayer_asset_path._M_dataplus._M_p != &sublayer_asset_path.field_2)
          goto LAB_001a9146;
          goto LAB_001a9153;
        }
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(psVar1 + -1),&sublayer_asset_path);
        ::std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector(&local_1640,layer_names_stack);
        err_00 = warn;
        bVar5 = CompositeSublayersRec
                          (resolver,&sublayer,&local_1640,composited_layer,warn,(string *)uVar4,
                           options);
        ::std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_1640);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&sublayer._asset_search_paths);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sublayer._current_working_path._M_dataplus._M_p !=
            &sublayer._current_working_path.field_2) {
          operator_delete(sublayer._current_working_path._M_dataplus._M_p,
                          CONCAT71(sublayer._current_working_path.field_2._M_allocated_capacity.
                                   _1_7_,sublayer._current_working_path.field_2._M_local_buf[0]) + 1
                         );
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::_M_erase(&sublayer._primspec_path_cache._M_t,
                   (_Link_type)
                   sublayer._primspec_path_cache._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent);
        LayerMetas::~LayerMetas(&sublayer._metas);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&sublayer._prim_specs._M_h);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sublayer._name._M_dataplus._M_p != &sublayer._name.field_2) {
          operator_delete(sublayer._name._M_dataplus._M_p,
                          sublayer._name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)layer_filepath._M_dataplus._M_p != &layer_filepath.field_2) {
          operator_delete(layer_filepath._M_dataplus._M_p,
                          layer_filepath.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sublayer_asset_path._M_dataplus._M_p != &sublayer_asset_path.field_2) {
          operator_delete(sublayer_asset_path._M_dataplus._M_p,
                          sublayer_asset_path.field_2._M_allocated_capacity + 1);
        }
        if (!bVar5) goto LAB_001a9153;
        args = args + 1;
      } while (args != local_17c0);
    }
    psVar1 = (layer_names_stack->
             super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(psVar1 + -1);
    (layer_names_stack->
    super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)this;
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(this,(_Link_type)psVar1[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    bVar5 = true;
  }
  else {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
LAB_001a9153:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool CompositeSublayersRec(AssetResolutionResolver &resolver,
                           const Layer &in_layer,
                           std::vector<std::set<std::string>> layer_names_stack,
                           Layer *composited_layer, std::string *warn,
                           std::string *err,
                           const SublayersCompositionOptions &options) {
  if (layer_names_stack.size() > options.max_depth) {
    if (err) {
      (*err) += "subLayer is nested too deeply.";
    }
    return false;
  }

  layer_names_stack.emplace_back(std::set<std::string>());
  std::set<std::string> &curr_layer_names = layer_names_stack.back();

  for (auto const &prim : in_layer.primspecs()) {
    if (composited_layer->has_primspec(prim.first))
    {
      if (!CombinePrimSpecRec(0, composited_layer->primspecs().at(prim.first), prim.second, warn, err)) {
        return false;
      }
    }
    else {
      composited_layer->add_primspec(prim.first, prim.second);
    }
  }

  for (const auto &layer : in_layer.metas().subLayers) {
    // TODO: subLayerOffset
    std::string sublayer_asset_path = layer.assetPath.GetAssetPath();

    // Do cyclic referencing check.
    // TODO: Use resolved name?
    if (IsVisited(layer_names_stack, sublayer_asset_path)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Circular referenceing detected for subLayer: {} in {}",
                      sublayer_asset_path, in_layer.name()));
    }

    std::string layer_filepath = resolver.resolve(sublayer_asset_path);
    if (layer_filepath.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format("{} not found in path: {}",
                                        sublayer_asset_path,
                                        resolver.search_paths_str()));
    }

    tinyusdz::Layer sublayer;
    if (!LoadAsset(resolver, in_layer.get_current_working_path(),
                   in_layer.get_asset_search_paths(), options.fileformats,
                   layer.assetPath, /* not_used */ Path::make_root_path(),
                   &sublayer, /* primspec_root */ nullptr,
                   options.error_when_no_prims_in_sublayer,
                   options.error_when_asset_not_found,
                   options.error_when_unsupported_fileformat, warn, err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Load asset in subLayer failed: `{}`", layer.assetPath));
    }

    curr_layer_names.insert(sublayer_asset_path);

    // Recursively load subLayer
    if (!CompositeSublayersRec(resolver, sublayer, layer_names_stack,
                               composited_layer, warn, err, options)) {
      return false;
    }
  }

  layer_names_stack.pop_back();

  return true;
}